

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Point2f pbrt::RejectionSampleDisk(RNG *rng)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar7._8_4_ = 0x3f7fffff;
  auVar7._0_8_ = 0x3f7fffff3f7fffff;
  auVar7._12_4_ = 0x3f7fffff;
  auVar8._8_4_ = 0xc0000000;
  auVar8._0_8_ = 0xc0000000c0000000;
  auVar8._12_4_ = 0xc0000000;
  auVar9._8_4_ = 0x3f800000;
  auVar9._0_8_ = 0x3f8000003f800000;
  auVar9._12_4_ = 0x3f800000;
  auVar1 = vpmovsxbq_avx(ZEXT216(0x2d1b));
  auVar2 = vpmovsxbq_avx(ZEXT216(0x1b2d));
  uVar4 = rng->state;
  do {
    uVar3 = uVar4 * 0x5851f42d4c957f2d + rng->inc;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar4;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar3;
    auVar5 = vpunpcklqdq_avx(auVar5,auVar10);
    auVar6 = vpsrlvq_avx2(auVar5,auVar1);
    auVar10 = vpsrlvq_avx2(auVar5,auVar2);
    auVar5 = vpsrlq_avx(auVar5,0x3b);
    auVar5 = vpshufd_avx(auVar5,0xe8);
    uVar4 = uVar3 * 0x5851f42d4c957f2d + rng->inc;
    auVar6 = vpshufd_avx(auVar6 ^ auVar10,0xe8);
    auVar5 = vprorvd_avx512vl(auVar6,auVar5);
    auVar5 = vcvtudq2ps_avx512vl(auVar5);
    auVar6._0_4_ = auVar5._0_4_ * 2.3283064e-10;
    auVar6._4_4_ = auVar5._4_4_ * 2.3283064e-10;
    auVar6._8_4_ = auVar5._8_4_ * 2.3283064e-10;
    auVar6._12_4_ = auVar5._12_4_ * 2.3283064e-10;
    auVar5 = vminps_avx(auVar6,auVar7);
    auVar6 = vfmadd213ps_fma(auVar5,auVar8,auVar9);
    auVar11._0_4_ = auVar6._0_4_ * auVar6._0_4_;
    auVar11._4_4_ = auVar6._4_4_ * auVar6._4_4_;
    auVar11._8_4_ = auVar6._8_4_ * auVar6._8_4_;
    auVar11._12_4_ = auVar6._12_4_ * auVar6._12_4_;
    auVar5 = vmovshdup_avx(auVar11);
    auVar5 = vfmadd231ss_fma(auVar5,auVar6,auVar6);
  } while (1.0 < auVar5._0_4_);
  rng->state = uVar4;
  return (Point2f)auVar6._0_8_;
}

Assistant:

Point2f RejectionSampleDisk(RNG &rng) {
    Point2f p;
    do {
        p.x = 1 - 2 * rng.Uniform<Float>();
        p.y = 1 - 2 * rng.Uniform<Float>();
    } while (p.x * p.x + p.y * p.y > 1);
    return p;
}